

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O2

void dosinkring(obj *obj)

{
  uchar *puVar1;
  undefined1 *puVar2;
  char cVar3;
  obj *poVar4;
  ulong uVar5;
  bool bVar6;
  xchar xVar7;
  level *plVar8;
  level *plVar9;
  boolean bVar10;
  uint x;
  uint uVar11;
  uint uVar12;
  char *pcVar13;
  char *pcVar14;
  trap *ptVar15;
  long lVar16;
  long lVar17;
  obj *obj_00;
  
  cVar3 = obj->where;
  pcVar13 = doname(obj);
  if (cVar3 == '\x03') {
    pcVar13 = "You drop %s down the drain.";
  }
  else {
    upstart(pcVar13);
    pcVar13 = "%s falls down the drain.";
  }
  pline(pcVar13);
  obj->field_0x4c = obj->field_0x4c | 0x80;
  bVar6 = false;
  switch(obj->otyp) {
  case 0x9e:
    goto code_r0x0016c4ac;
  case 0x9f:
    goto code_r0x0016c4ac;
  case 0xa0:
    pcVar13 = "The water seems %ser now.";
    break;
  case 0xa1:
    goto code_r0x0016c4ac;
  case 0xa2:
code_r0x0016c4ac:
    pcVar13 = "The water flow seems %ser now.";
    break;
  case 0xa3:
    pcVar13 = "The water flow %s the drain.";
    break;
  case 0xa4:
    pcVar13 = "The water\'s force seems %ser now.";
    break;
  case 0xa5:
  case 0xa6:
  case 0xa8:
  case 0xae:
  case 0xb0:
  case 0xb1:
  case 0xb3:
    goto switchD_0016c3b6_caseD_a5;
  case 0xa7:
    pcVar13 = xname(obj);
    pline("You thought your %s got lost in the sink, but there it is!",pcVar13);
    goto LAB_0016c758;
  case 0xa9:
    pcVar13 = "The water flow seems fixed.";
    goto LAB_0016c6a4;
  case 0xaa:
    pcVar13 = "The sink quivers upward for a moment.";
    goto LAB_0016c6a4;
  case 0xab:
    bVar6 = false;
    poVar4 = level->objects[u.ux][u.uy];
    while (obj_00 = poVar4, obj_00 != (obj *)0x0) {
      poVar4 = (obj_00->v).v_nexthere;
      if (((obj_00 != uball) && (obj_00 != uchain)) &&
         (bVar10 = obj_resists(obj_00,1,99), bVar10 == '\0')) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0016c584;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0016c57f;
LAB_0016c5aa:
          pcVar13 = doname(obj_00);
          pcVar14 = otense(obj_00,"vanish");
          pline("Suddenly, %s %s from the sink!",pcVar13,pcVar14);
          bVar6 = true;
        }
        else {
LAB_0016c57f:
          if (ublindf != (obj *)0x0) {
LAB_0016c584:
            if (ublindf->oartifact == '\x1d') goto LAB_0016c5aa;
          }
        }
        delobj(obj_00);
      }
    }
    goto switchD_0016c3b6_caseD_a5;
  case 0xac:
    if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
       ((u.umonnum == u.umonster || (bVar10 = dmgtype(youmonst.data,0x24), bVar10 == '\0')))) {
      pcVar13 = rndmonnam();
      makeplural(pcVar13);
    }
    pcVar13 = "Several %s buzz angrily around the sink.";
    break;
  case 0xad:
    You_hear("loud noises coming from the drain.");
    goto LAB_0016c6ab;
  case 0xaf:
    pcVar13 = fruitname('\0');
    makeplural(pcVar13);
    pcVar13 = "You smell rotten %s.";
    break;
  case 0xb2:
    pcVar13 = "Static electricity surrounds the sink.";
LAB_0016c6a4:
    pline(pcVar13);
    goto LAB_0016c6ab;
  case 0xb4:
    pline("The ring is regurgitated!");
LAB_0016c758:
    obj->field_0x4c = obj->field_0x4c & 0x7f;
    dropx(obj);
    discover_object((int)obj->otyp,'\x01','\x01');
    return;
  default:
    if (obj->otyp == 0x113) {
      if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
         ((u.umonnum == u.umonster || (bVar10 = dmgtype(youmonst.data,0x24), bVar10 == '\0')))) {
        pcVar13 = rndmonnam();
        makeplural(pcVar13);
      }
      pcVar13 = "Several %s buzz around the sink.";
      break;
    }
    goto switchD_0016c3b6_caseD_a5;
  }
  pline(pcVar13);
LAB_0016c6ab:
  bVar6 = true;
switchD_0016c3b6_caseD_a5:
  plVar8 = level;
  xVar7 = u.ux;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0016c6cf;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0016c6ca;
    if (!bVar6) goto LAB_0016c71c;
    goto switchD_0016c73c_caseD_9e;
  }
LAB_0016c6ca:
  if (ublindf == (obj *)0x0) {
LAB_0016c6d9:
    if (!bVar6) {
switchD_0016c73c_caseD_ab:
      You_hear("the ring bouncing down the drainpipe.");
      goto LAB_0016ca77;
    }
    goto switchD_0016c73c_caseD_9e;
  }
LAB_0016c6cf:
  if (ublindf->oartifact != '\x1d' || bVar6) goto LAB_0016c6d9;
LAB_0016c71c:
  switch(obj->otyp) {
  case 0x9d:
    pcVar13 = "The faucets flash brightly for a moment.";
    break;
  default:
    goto switchD_0016c73c_caseD_9e;
  case 0xa5:
    pcVar13 = "silver";
    if (obj->spe < '\0') {
      pcVar13 = "black";
    }
    goto LAB_0016c870;
  case 0xa6:
    pcVar13 = "The sink looks as good as new.";
    break;
  case 0xa8:
    pcVar13 = "The sink seems to blend into the floor for a moment.";
    break;
  case 0xab:
    goto switchD_0016c73c_caseD_ab;
  case 0xae:
    pcVar13 = "red";
LAB_0016c870:
    pcVar13 = hcolor(pcVar13);
    pcVar14 = "The sink glows %s for a moment.";
LAB_0016ca62:
    pline(pcVar14,pcVar13);
    goto switchD_0016c73c_caseD_9e;
  case 0xb0:
    pcVar13 = "The hot water faucet flashes brightly for a moment.";
    break;
  case 0xb1:
    pcVar13 = "The cold water faucet flashes brightly for a moment.";
    break;
  case 0xb3:
    pcVar13 = "You see the ring slide right down the drain!";
    break;
  case 0xb5:
    lVar17 = (long)u.ux;
    lVar16 = (long)u.uy;
    uVar12 = 0;
    do {
      x = rnd(0x4f);
      uVar11 = mt_random();
      plVar9 = level;
      uVar5 = (ulong)uVar11 % 0x15;
      ptVar15 = t_at(level,x,(int)uVar5);
      if ((plVar9->locations[x][uVar5].typ == '\x19') && (ptVar15 == (trap *)0x0)) {
        if (((viz_array[uVar5][x] & 2U) == 0) || (199 < uVar12)) goto LAB_0016c9c7;
      }
      else if (199 < uVar12) {
        pcVar13 = "The sink momentarily vanishes.";
        goto LAB_0016ca21;
      }
      uVar12 = uVar12 + 1;
    } while( true );
  case 0xb6:
    pcVar13 = "The sink looks like it is being beamed aboard somewhere.";
    break;
  case 0xb7:
    lVar17 = (long)u.uy;
    if (level->locations[u.ux][lVar17].typ != '\x1f') goto switchD_0016c73c_caseD_9e;
    puVar1 = &(level->flags).nsinks;
    *puVar1 = *puVar1 + 0xff;
    lVar16 = (long)xVar7;
    puVar2 = &plVar8->locations[lVar16][lVar17].field_0x6;
    *(uint *)puVar2 = *(uint *)puVar2 & 0xfffffe0f;
    uVar12 = mt_random();
    switch(uVar12 & 3) {
    case 0:
      plVar8->locations[lVar16][lVar17].typ = '\x1c';
      (level->flags).nfountains = (level->flags).nfountains + '\x01';
      break;
    case 1:
      plVar8->locations[lVar16][lVar17].typ = '\x1d';
      goto LAB_0016cb59;
    case 2:
      plVar8->locations[lVar16][lVar17].typ = '!';
      mt_random();
      uVar12 = mt_random();
      if (uVar12 % 3 == 2) {
        uVar12 = 0x40;
      }
      else {
        uVar12 = mt_random();
        uVar12 = (uVar12 % 3) * 0x10 + 0x10;
      }
      *(uint *)&plVar8->locations[lVar16][lVar17].field_0x6 =
           *(uint *)&plVar8->locations[lVar16][lVar17].field_0x6 & 0xfffffe0f | uVar12;
      break;
    case 3:
      plVar8->locations[lVar16][lVar17].typ = '\x19';
      make_grave(level,(int)u.ux,(int)u.uy,(char *)0x0);
    }
    if (plVar8->locations[lVar16][lVar17].typ == '\x1d') {
LAB_0016cb59:
      pcVar13 = "a throne";
    }
    else {
      pcVar13 = surface((int)u.ux,(int)u.uy);
      pcVar13 = an(pcVar13);
    }
    pline("The sink transforms into %s!",pcVar13);
    newsym((int)u.ux,(int)u.uy);
    goto switchD_0016c73c_caseD_9e;
  case 0xb8:
    pline("The sink transforms into another sink!");
    puVar2 = &level->locations[u.ux][u.uy].field_0x6;
    *(uint *)puVar2 = *(uint *)puVar2 & 0xfffffe0f;
    goto switchD_0016c73c_caseD_9e;
  case 0xb9:
    pcVar13 = "The water flow momentarily vanishes.";
    break;
  case 0xba:
    pcVar13 = "air";
    if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
      if (u.umonnum == u.umonster) {
        pcVar13 = "oxygen molecules";
      }
      else {
        bVar10 = dmgtype(youmonst.data,0x24);
        pcVar13 = "air";
        if (bVar10 == '\0') {
          pcVar13 = "oxygen molecules";
        }
      }
    }
    pcVar14 = "You see some %s in the sink.";
    goto LAB_0016ca62;
  case 0xbb:
    pcVar13 = "The sink looks nothing like a fountain.";
  }
  pline(pcVar13);
switchD_0016c73c_caseD_9e:
  discover_object((int)obj->otyp,'\x01','\x01');
LAB_0016ca77:
  uVar12 = mt_random();
  if (uVar12 % 0x14 == 0) {
    pcVar13 = doname(obj);
    pline("The sink backs up, leaving %s.",pcVar13);
    obj->field_0x4c = obj->field_0x4c & 0x7f;
    dropx(obj);
    return;
  }
  if (cVar3 == '\x03') {
    useup(obj);
    return;
  }
  obfree(obj,(obj *)0x0);
  return;
LAB_0016c9c7:
  plVar9->locations[x][uVar5].typ = '\x1f';
  *(uint *)&plVar9->locations[x][uVar5].field_0x6 =
       *(uint *)&plVar9->locations[x][uVar5].field_0x6 & 0xfffffe0f |
       *(uint *)&plVar8->locations[lVar17][lVar16].field_0x6 & 0x1f0;
  newsym(x,(int)uVar5);
  plVar8->locations[lVar17][lVar16].typ = '\x19';
  puVar2 = &plVar8->locations[lVar17][lVar16].field_0x6;
  *(uint *)puVar2 = *(uint *)puVar2 & 0xfffffe0f;
  newsym((int)u.ux,(int)u.uy);
  pcVar13 = "The sink vanishes!";
LAB_0016ca21:
  pline(pcVar13);
  goto switchD_0016c73c_caseD_9e;
}

Assistant:

static void dosinkring(struct obj *obj)  /* obj is a ring being dropped over a kitchen sink */
{
	struct obj *otmp,*otmp2;
	boolean ideed = TRUE;
	boolean ring_in_inv = carried(obj);

	if (ring_in_inv)
	    pline("You drop %s down the drain.", doname(obj));
	else
	    pline("%s falls down the drain.", upstart(doname(obj)));

	obj->in_use = TRUE;	/* block free identification via interrupt */
	switch(obj->otyp) {	/* effects that can be noticed without eyes */
	    case RIN_SEARCHING:
		pline("You thought your %s got lost in the sink, but there it is!",
			xname(obj));
		goto giveback;
	    case RIN_SLOW_DIGESTION:
		pline("The ring is regurgitated!");
giveback:
		obj->in_use = FALSE;
		dropx(obj);
		makeknown(obj->otyp);
		return;
	    case RIN_LEVITATION:
		pline("The sink quivers upward for a moment.");
		break;
	    case RIN_POISON_RESISTANCE:
		pline("You smell rotten %s.", makeplural(fruitname(FALSE)));
		break;
	    case RIN_AGGRAVATE_MONSTER:
		pline("Several %s buzz angrily around the sink.",
		      Hallucination ? makeplural(rndmonnam()) : "flies");
		break;
	    case RIN_SHOCK_RESISTANCE:
		pline("Static electricity surrounds the sink.");
		break;
	    case RIN_CONFLICT:
		You_hear("loud noises coming from the drain.");
		break;
	    case RIN_SUSTAIN_ABILITY:	/* KMH */
		pline("The water flow seems fixed.");
		break;
	    case RIN_GAIN_STRENGTH:
		pline("The water flow seems %ser now.",
			(obj->spe<0) ? "weak" : "strong");
		break;
	    case RIN_GAIN_CONSTITUTION:
		pline("The water flow seems %ser now.",
			(obj->spe<0) ? "less" : "great");
		break;
	    case RIN_GAIN_INTELLIGENCE:
		pline("The water seems %ser now.",
			(obj->spe<0) ? "dimm" : "bright");
		break;
	    case RIN_GAIN_WISDOM:
		pline("The water flow seems %ser now.",
			(obj->spe<0) ? "dull" : "quick");
		break;
	    case RIN_GAIN_DEXTERITY:
		pline("The water flow seems %ser now.",
			(obj->spe<0) ? "slow" : "fast");
		break;
	    case RIN_INCREASE_ACCURACY:	/* KMH */
		pline("The water flow %s the drain.",
			(obj->spe<0) ? "misses" : "hits");
		break;
	    case RIN_INCREASE_DAMAGE:
		pline("The water's force seems %ser now.",
			(obj->spe<0) ? "small" : "great");
		break;
	    case RIN_HUNGER:
		ideed = FALSE;
		for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp2) {
		    otmp2 = otmp->nexthere;
		    if (otmp != uball && otmp != uchain &&
			    !obj_resists(otmp, 1, 99)) {
			if (!Blind) {
			    pline("Suddenly, %s %s from the sink!",
				  doname(otmp), otense(otmp, "vanish"));
			    ideed = TRUE;
			}
			delobj(otmp);
		    }
		}
		break;
	    case MEAT_RING:
		/* Not the same as aggravate monster; besides, it's obvious. */
		pline("Several %s buzz around the sink.",
		      Hallucination ? makeplural(rndmonnam()) : "flies");
		break;
	    default:
		ideed = FALSE;
		break;
	}
	if (!Blind && !ideed && obj->otyp != RIN_HUNGER) {
	    ideed = TRUE;
	    switch(obj->otyp) {		/* effects that need eyes */
		case RIN_ADORNMENT:
		    pline("The faucets flash brightly for a moment.");
		    break;
		case RIN_REGENERATION:
		    pline("The sink looks as good as new.");
		    break;
		case RIN_INVISIBILITY:
		    pline("The water flow momentarily vanishes.");
		    break;
		case RIN_FREE_ACTION:
		    pline("You see the ring slide right down the drain!");
		    break;
		case RIN_SEE_INVISIBLE:
		    pline("You see some %s in the sink.",
			  Hallucination ? "oxygen molecules" : "air");
		    break;
		case RIN_STEALTH:
		pline("The sink seems to blend into the floor for a moment.");
		    break;
		case RIN_FIRE_RESISTANCE:
		pline("The hot water faucet flashes brightly for a moment.");
		    break;
		case RIN_COLD_RESISTANCE:
		pline("The cold water faucet flashes brightly for a moment.");
		    break;
		case RIN_PROTECTION_FROM_SHAPE_CHANGERS:
		    pline("The sink looks nothing like a fountain.");
		    break;
		case RIN_PROTECTION:
		    pline("The sink glows %s for a moment.",
			    hcolor((obj->spe<0) ? "black" : "silver"));
		    break;
		case RIN_WARNING:
		    pline("The sink glows %s for a moment.", hcolor("red"));
		    break;
		case RIN_TELEPORTATION:
		    if (teleport_sink())
			pline("The sink vanishes!");
		    else
			pline("The sink momentarily vanishes.");
		    break;
		case RIN_TELEPORT_CONTROL:
	    pline("The sink looks like it is being beamed aboard somewhere.");
		    break;
		case RIN_POLYMORPH:
		    polymorph_sink();
		    break;
		case RIN_POLYMORPH_CONTROL:
		    pline("The sink transforms into another sink!");
		    level->locations[u.ux][u.uy].looted = 0;
		    break;
	    }
	}
	if (ideed)
	    makeknown(obj->otyp);
	else
	    You_hear("the ring bouncing down the drainpipe.");
	if (!rn2(20)) {
		pline("The sink backs up, leaving %s.", doname(obj));
		obj->in_use = FALSE;
		dropx(obj);
	} else {
	    if (ring_in_inv)
		useup(obj);
	    else
		obfree(obj, NULL);
	}
}